

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper_tests.cpp
# Opt level: O2

void __thiscall dbwrapper_tests::dbwrapper::test_method(dbwrapper *this)

{
  char cVar1;
  long lVar2;
  bool bVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *key_00;
  long lVar4;
  char *p2;
  iterator in_R8;
  iterator pvVar5;
  string *in_R9;
  iterator pvVar6;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  string *in_stack_fffffffffffffd50;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  lazy_ostream local_1e0;
  undefined1 *local_1d0;
  string *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  uint8_t key;
  char local_19a [2];
  string local_198;
  string local_178;
  uint256 res;
  uint256 in;
  CDBWrapper dbw;
  path local_88;
  path ph;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_19a[0] = '\0';
  local_19a[1] = '\x01';
  for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
    cVar1 = local_19a[lVar4];
    ArgsManager::GetDataDirBase
              ((path *)&local_88,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args);
    p2 = "dbwrapper_obfuscate_false";
    if (cVar1 != '\0') {
      p2 = "dbwrapper_obfuscate_true";
    }
    fs::operator/((path *)&ph.super_path,(path *)&local_88,p2);
    std::filesystem::__cxx11::path::~path(&local_88);
    std::filesystem::__cxx11::path::path((path *)&in,&ph.super_path);
    CDBWrapper::CDBWrapper(&dbw,(DBParams *)&in);
    std::filesystem::__cxx11::path::~path((path *)&in);
    key = 'k';
    RandomMixin<FastRandomContext>::rand256
              (&in,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng.
                    super_RandomMixin<FastRandomContext>);
    res.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    local_1b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_1a8 = "";
    local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = (iterator)in_R9;
    msg.m_begin = in_R8;
    file.m_end = &DAT_00000028;
    file.m_begin = (iterator)&local_1b0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1c0,msg);
    key_00 = dbwrapper_private::GetObfuscateKey(&dbw);
    bVar3 = is_null_key(key_00);
    local_178._M_dataplus._M_p._0_1_ = (bool)cVar1 != bVar3;
    local_178._M_string_length = 0;
    local_178.field_2._M_allocated_capacity = 0;
    local_198._M_dataplus._M_p = "obfuscate != is_null_key(dbwrapper_private::GetObfuscateKey(dbw))"
    ;
    local_198._M_string_length = 0xb7b363;
    local_1e0.m_empty = false;
    local_1e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
    local_1d0 = boost::unit_test::lazy_ostream::inst;
    local_1c8 = &local_198;
    local_1f0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_1e8 = "";
    pvVar5 = &DAT_00000001;
    pvVar6 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_178,&local_1e0,1,0,WARN,
               (check_type)in_stack_fffffffffffffd50,(size_t)&local_1f0,0x28);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_178.field_2._M_allocated_capacity);
    local_200 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_1f8 = "";
    local_210 = &boost::unit_test::basic_cstring<char_const>::null;
    local_208 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_00.m_end = pvVar6;
    msg_00.m_begin = pvVar5;
    file_00.m_end = (iterator)0x2a;
    file_00.m_begin = (iterator)&local_200;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_210,
               msg_00);
    local_178._M_dataplus._M_p._0_1_ = CDBWrapper::Write<unsigned_char,uint256>(&dbw,&key,&in,false)
    ;
    local_178._M_string_length = 0;
    local_178.field_2._M_allocated_capacity = 0;
    local_198._M_dataplus._M_p = "dbw.Write(key, in)";
    local_198._M_string_length = 0xb7b376;
    local_1e0.m_empty = false;
    local_1e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
    local_1d0 = boost::unit_test::lazy_ostream::inst;
    local_1c8 = &local_198;
    local_220 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_218 = "";
    pvVar5 = &DAT_00000001;
    pvVar6 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_178,&local_1e0,1,0,WARN,
               (check_type)in_stack_fffffffffffffd50,(size_t)&local_220,0x2a);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_178.field_2._M_allocated_capacity);
    local_230 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_228 = "";
    local_240 = &boost::unit_test::basic_cstring<char_const>::null;
    local_238 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_01.m_end = pvVar6;
    msg_01.m_begin = pvVar5;
    file_01.m_end = (iterator)0x2b;
    file_01.m_begin = (iterator)&local_230;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_240,
               msg_01);
    local_178._M_dataplus._M_p._0_1_ = CDBWrapper::Read<unsigned_char,uint256>(&dbw,&key,&res);
    local_178._M_string_length = 0;
    local_178.field_2._M_allocated_capacity = 0;
    local_198._M_dataplus._M_p = "dbw.Read(key, res)";
    local_198._M_string_length = 0xb7b389;
    local_1e0.m_empty = false;
    local_1e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
    local_1d0 = boost::unit_test::lazy_ostream::inst;
    local_1c8 = &local_198;
    local_250 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_248 = "";
    pvVar5 = &DAT_00000001;
    pvVar6 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_178,&local_1e0,1,0,WARN,
               (check_type)in_stack_fffffffffffffd50,(size_t)&local_250,0x2b);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_178.field_2._M_allocated_capacity);
    local_260 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_258 = "";
    local_270 = &boost::unit_test::basic_cstring<char_const>::null;
    local_268 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_02.m_end = pvVar6;
    msg_02.m_begin = pvVar5;
    file_02.m_end = (iterator)0x2c;
    file_02.m_begin = (iterator)&local_260;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_270,
               msg_02);
    local_1e0.m_empty = false;
    local_1e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
    local_1d0 = boost::unit_test::lazy_ostream::inst;
    local_1c8 = (string *)0xc694e1;
    local_280 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_278 = "";
    base_blob<256u>::ToString_abi_cxx11_(&local_178,(base_blob<256u> *)&res);
    base_blob<256u>::ToString_abi_cxx11_(&local_198,(base_blob<256u> *)&in);
    in_R8 = (iterator)0x2;
    in_R9 = &local_178;
    in_stack_fffffffffffffd50 = &local_198;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (&local_1e0,&local_280,0x2c,1,2,&local_178,"res.ToString()",&local_198,"in.ToString()"
              );
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_178);
    CDBWrapper::~CDBWrapper(&dbw);
    std::filesystem::__cxx11::path::~path(&ph.super_path);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(dbwrapper)
{
    // Perform tests both obfuscated and non-obfuscated.
    for (const bool obfuscate : {false, true}) {
        fs::path ph = m_args.GetDataDirBase() / (obfuscate ? "dbwrapper_obfuscate_true" : "dbwrapper_obfuscate_false");
        CDBWrapper dbw({.path = ph, .cache_bytes = 1 << 20, .memory_only = true, .wipe_data = false, .obfuscate = obfuscate});
        uint8_t key{'k'};
        uint256 in = m_rng.rand256();
        uint256 res;

        // Ensure that we're doing real obfuscation when obfuscate=true
        BOOST_CHECK(obfuscate != is_null_key(dbwrapper_private::GetObfuscateKey(dbw)));

        BOOST_CHECK(dbw.Write(key, in));
        BOOST_CHECK(dbw.Read(key, res));
        BOOST_CHECK_EQUAL(res.ToString(), in.ToString());
    }
}